

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogLookup::CatalogLookup
          (CatalogLookup *this,Catalog *catalog,string *schema_p,EntryLookupInfo *lookup_p)

{
  this->catalog = catalog;
  ::std::__cxx11::string::string((string *)&this->schema,(string *)schema_p);
  ::std::__cxx11::string::string((string *)&this->name,(string *)lookup_p->name);
  EntryLookupInfo::EntryLookupInfo(&this->lookup_info,lookup_p,&this->name);
  return;
}

Assistant:

CatalogLookup(Catalog &catalog, string schema_p, const EntryLookupInfo &lookup_p)
	    : catalog(catalog), schema(std::move(schema_p)), name(lookup_p.GetEntryName()), lookup_info(lookup_p, name) {
	}